

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprinterinfo.cpp
# Opt level: O0

QList<QPrinter::ColorMode> * __thiscall QPrinterInfo::supportedColorModes(QPrinterInfo *this)

{
  bool bVar1;
  const_iterator o;
  QList<QPrinter::ColorMode> *in_RSI;
  QList<QPrinter::ColorMode> *in_RDI;
  long in_FS_OFFSET;
  ColorMode mode;
  QList<QPrint::ColorMode> *__range1;
  QPrinterInfoPrivate *d;
  QList<QPrinter::ColorMode> *list;
  const_iterator __end1;
  const_iterator __begin1;
  QList<QPrint::ColorMode> supportedColorModes;
  QList<QPrinter::ColorMode> *this_00;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  const_iterator local_28;
  QList<QPrint::ColorMode> local_20;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  d_func((QPrinterInfo *)0x14d506);
  (this_00->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (this_00->d).ptr = (ColorMode *)0xaaaaaaaaaaaaaaaa;
  (this_00->d).size = -0x5555555555555556;
  QList<QPrinter::ColorMode>::QList((QList<QPrinter::ColorMode> *)0x14d53a);
  local_20.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_20.d.ptr = (ColorMode *)0xaaaaaaaaaaaaaaaa;
  local_20.d.size = -0x5555555555555556;
  QPrintDevice::supportedColorModes
            ((QPrintDevice *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  QList<QPrint::ColorMode>::size(&local_20);
  QList<QPrinter::ColorMode>::reserve(in_RSI,asize);
  local_28.i = (ColorMode *)0xaaaaaaaaaaaaaaaa;
  local_28 = QList<QPrint::ColorMode>::begin((QList<QPrint::ColorMode> *)this_00);
  o = QList<QPrint::ColorMode>::end((QList<QPrint::ColorMode> *)this_00);
  while (bVar1 = QList<QPrint::ColorMode>::const_iterator::operator!=(&local_28,o), bVar1) {
    QList<QPrint::ColorMode>::const_iterator::operator*(&local_28);
    QList<QPrinter::ColorMode>::operator<<(this_00,(parameter_type)((ulong)in_RDI >> 0x20));
    QList<QPrint::ColorMode>::const_iterator::operator++(&local_28);
  }
  QList<QPrint::ColorMode>::~QList((QList<QPrint::ColorMode> *)0x14d62b);
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QPrinter::ColorMode> QPrinterInfo::supportedColorModes() const
{
    Q_D(const QPrinterInfo);
    QList<QPrinter::ColorMode> list;
    const auto supportedColorModes = d->m_printDevice.supportedColorModes();
    list.reserve(supportedColorModes.size());
    for (QPrint::ColorMode mode : supportedColorModes)
        list << QPrinter::ColorMode(mode);
    return list;
}